

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::BeginDisabled(bool disabled)

{
  byte in_DIL;
  bool bVar1;
  bool was_disabled;
  ImGuiContext *g;
  undefined7 in_stack_ffffffffffffffe8;
  ImGuiContext *this;
  
  this = GImGui;
  bVar1 = (GImGui->CurrentItemFlags & 0x400U) != 0;
  if ((!bVar1) && ((in_DIL & 1) != 0)) {
    GImGui->DisabledAlphaBackup = (GImGui->Style).Alpha;
    (this->Style).Alpha = (this->Style).DisabledAlpha * (this->Style).Alpha;
  }
  if ((bVar1) || ((in_DIL & 1) != 0)) {
    this->CurrentItemFlags = this->CurrentItemFlags | 0x400;
  }
  ImVector<int>::push_back((ImVector<int> *)this,(int *)CONCAT17(bVar1,in_stack_ffffffffffffffe8));
  this->DisabledStackSize = this->DisabledStackSize + 1;
  return;
}

Assistant:

void ImGui::BeginDisabled(bool disabled)
{
    ImGuiContext& g = *GImGui;
    bool was_disabled = (g.CurrentItemFlags & ImGuiItemFlags_Disabled) != 0;
    if (!was_disabled && disabled)
    {
        g.DisabledAlphaBackup = g.Style.Alpha;
        g.Style.Alpha *= g.Style.DisabledAlpha; // PushStyleVar(ImGuiStyleVar_Alpha, g.Style.Alpha * g.Style.DisabledAlpha);
    }
    if (was_disabled || disabled)
        g.CurrentItemFlags |= ImGuiItemFlags_Disabled;
    g.ItemFlagsStack.push_back(g.CurrentItemFlags); // FIXME-OPT: can we simply skip this and use DisabledStackSize?
    g.DisabledStackSize++;
}